

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

bool GUINewFrame(HGUI handle,vector<GUIComponent,_std::allocator<GUIComponent>_> *gui_components,
                vector<GUITexture,_std::allocator<GUITexture>_> *textures)

{
  bool bVar1;
  iterator __begin1;
  pointer pGVar2;
  ulong uVar3;
  pointer pGVar4;
  int *widths_00;
  float *pfVar5;
  int iVar6;
  mu_Context *pmVar7;
  float *pfVar8;
  int i;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  mu_Rect mVar13;
  int empty_width [1];
  int widths [4];
  int column_widths [2];
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  int local_70;
  int local_6c;
  int local_68;
  uint local_64;
  int local_60;
  int local_5c;
  pointer local_58;
  int local_50 [3];
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  pGVar2 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pGVar4 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (pGVar2 == pGVar4) {
    if ((textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0010c022;
LAB_0010c0ef:
    bVar1 = false;
  }
  else {
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)pGVar2->IsInUse;
      pGVar2 = pGVar2 + 1;
    } while (pGVar2 != pGVar4);
    if (iVar6 == 0) {
LAB_0010c022:
      if ((textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
          super__Vector_impl_data._M_start ==
          (textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0010c0ef;
    }
    local_8c = -1;
    mu_begin(*(mu_Context **)((long)handle + 0x10));
    pmVar7 = *(mu_Context **)((long)handle + 0x10);
    mVar13 = mu_rect(0,0,300,*(int *)((long)handle + 0x1a0c9c));
    iVar6 = mu_begin_window_ex(pmVar7,"",mVar13,0x2080);
    if (iVar6 != 0) {
      if (*(long *)((long)handle + 0x1a0cb0) == 0) {
        pGVar2 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pGVar4 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pGVar2 != pGVar4) {
          fVar11 = (float)*(int *)(*(long *)(*(long *)((long)handle + 0x10) + 0x78) + 0x10);
          fVar12 = fVar11 * -0.5;
          local_6c = (int)(fVar12 + 75.0);
          local_70 = (int)(fVar12 + 50.0);
          local_68 = (int)(fVar12 + 37.5);
          local_50[2] = (int)(-fVar11 * 0.5 + 30.0);
          pfVar8 = pGVar2->Data;
          local_58 = pGVar4;
          iStack_44 = local_50[2];
          iStack_40 = local_50[2];
          iStack_3c = local_50[2];
LAB_0010c191:
          if (pGVar2->IsInUse == true) {
            local_50[0] = 0x96;
            local_50[1] = 0x87;
            mu_layout_row(*(mu_Context **)((long)handle + 0x10),2,local_50,0);
            mu_layout_begin_column(*(mu_Context **)((long)handle + 0x10));
            uVar3 = (ulong)pGVar2->Type;
            switch(uVar3) {
            case 0:
              pmVar7 = *(mu_Context **)((long)handle + 0x10);
              iVar6 = 1;
              widths_00 = &local_8c;
              goto LAB_0010c277;
            case 1:
              local_88 = CONCAT44(0xffffffff,local_6c);
              pmVar7 = *(mu_Context **)((long)handle + 0x10);
              iVar6 = 2;
              break;
            case 2:
              local_88 = CONCAT44(local_70,local_70);
              uStack_80 = CONCAT44(uStack_80._4_4_,0xffffffff);
              pmVar7 = *(mu_Context **)((long)handle + 0x10);
              iVar6 = 3;
              break;
            case 3:
            case 4:
              local_88 = CONCAT44(local_68,local_68);
              uStack_80 = CONCAT44(0xffffffff,local_68);
              pmVar7 = *(mu_Context **)((long)handle + 0x10);
              iVar6 = 4;
              break;
            case 5:
              local_88 = CONCAT44(iStack_44,local_50[2]);
              uStack_80 = CONCAT44(iStack_3c,iStack_40);
              local_78 = 0xffffffff;
              pmVar7 = *(mu_Context **)((long)handle + 0x10);
              iVar6 = 5;
              break;
            default:
              goto switchD_0010c1e6_default;
            }
            widths_00 = (int *)&local_88;
LAB_0010c277:
            mu_layout_row(pmVar7,iVar6,widths_00,0);
            uVar3 = (ulong)pGVar2->Type;
            if (EGUIComponentTypeSlider4 < pGVar2->Type) {
switchD_0010c1e6_default:
              uVar10 = 0;
              pfVar5 = pfVar8;
              do {
                if (5 < (uint)uVar3) {
LAB_0010c45c:
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/gui.h"
                                ,0x58,"uint32_t GUIComponents(EGUIComponentType)");
                }
                if (*(ulong *)(&DAT_001586f0 + uVar3 * 8) <= uVar10) goto LAB_0010c349;
                *pfVar5 = *pfVar5 * 255.0;
                mu_slider_ex(*(mu_Context **)((long)handle + 0x10),pfVar5,0.0,255.0,0.0,"%.0f",1);
                *pfVar5 = *pfVar5 / 255.0;
                uVar10 = uVar10 + 1;
                uVar3 = (ulong)pGVar2->Type;
                pfVar5 = pfVar5 + 1;
              } while( true );
            }
            uVar10 = 0;
            pfVar5 = pfVar8;
            while( true ) {
              if (5 < (uint)uVar3) goto LAB_0010c45c;
              if (*(ulong *)(&DAT_001586f0 + uVar3 * 8) <= uVar10) break;
              mu_slider_ex(*(mu_Context **)((long)handle + 0x10),pfVar5,
                           (pGVar2->field_4).SliderRange.Start,(pGVar2->field_4).SliderRange.End,
                           0.01,"%.2f",1);
              uVar10 = uVar10 + 1;
              uVar3 = (ulong)pGVar2->Type;
              pfVar5 = pfVar5 + 1;
            }
            goto LAB_0010c3e5;
          }
          goto LAB_0010c428;
        }
      }
      else {
        mu_layout_row(*(mu_Context **)((long)handle + 0x10),1,&local_8c,-1);
        mu_begin_panel_ex(*(mu_Context **)((long)handle + 0x10),"Log Output",0);
        mu_get_current_container(*(mu_Context **)((long)handle + 0x10));
        mu_layout_row(*(mu_Context **)((long)handle + 0x10),1,&local_8c,-1);
        mu_text(*(mu_Context **)((long)handle + 0x10),*(char **)((long)handle + 0x1a0ca8));
        mu_end_panel(*(mu_Context **)((long)handle + 0x10));
      }
LAB_0010c439:
      mu_end_window(*(mu_Context **)((long)handle + 0x10));
    }
    mu_end(*(mu_Context **)((long)handle + 0x10));
    bVar1 = true;
  }
  return bVar1;
LAB_0010c349:
  local_5c = (int)(pGVar2->Data[0] * 255.0);
  local_60 = (int)(pGVar2->Data[1] * 255.0);
  local_64 = (uint)(pGVar2->Data[2] * 255.0);
  uVar9 = 0xff000000;
  if ((0x17U >> ((uint)uVar3 & 0x1f) & 1) == 0) {
    uVar9 = (int)(pGVar2->Data[3] * 255.0) << 0x18;
  }
  pmVar7 = *(mu_Context **)((long)handle + 0x10);
  mVar13 = mu_layout_next(pmVar7);
  mu_draw_rect(pmVar7,mVar13,
               (mu_Color)
               ((uint)CONCAT11((undefined1)local_60,(undefined1)local_5c) |
               (local_64 & 0xff) << 0x10 | uVar9));
LAB_0010c3e5:
  mu_layout_end_column(*(mu_Context **)((long)handle + 0x10));
  mu_layout_begin_column(*(mu_Context **)((long)handle + 0x10));
  mu_layout_row(*(mu_Context **)((long)handle + 0x10),1,&local_8c,0);
  mu_label(*(mu_Context **)((long)handle + 0x10),(pGVar2->UniformName)._M_dataplus._M_p);
  mu_layout_end_column(*(mu_Context **)((long)handle + 0x10));
  pGVar4 = local_58;
LAB_0010c428:
  pGVar2 = pGVar2 + 1;
  pfVar8 = pfVar8 + 0x12;
  if (pGVar2 == pGVar4) goto LAB_0010c439;
  goto LAB_0010c191;
}

Assistant:

bool GUINewFrame(HGUI handle, std::vector<GUIComponent>& gui_components, std::vector<GUITexture> textures) {
    if (gui_components.empty() && textures.empty()) {
        return false;
    }

    uint32_t components_in_use = 0;
    for (const GUIComponent& component : gui_components) {
        if (component.IsInUse)
            ++components_in_use;
    }

    if (components_in_use == 0 && textures.empty()) {
        return false;
    }

    GUI* gui = (GUI*)handle;
    int window_w = 300;
    int empty_width[1] = {-1};

    mu_begin(gui->Ctx);
    if (mu_begin_window_ex(gui->Ctx, "", mu_rect(0, 0, window_w, gui->Height), MU_OPT_NOTITLE | MU_OPT_FORCE_RESIZE)) {
        if (!gui->Log.empty()) {
            mu_layout_row(gui->Ctx, 1, empty_width, -1);
            mu_begin_panel(gui->Ctx, "Log Output");
            mu_Container* panel = mu_get_current_container(gui->Ctx);

            mu_layout_row(gui->Ctx, 1, empty_width, -1);
            mu_text(gui->Ctx, gui->Log.c_str());
            mu_end_panel(gui->Ctx);
        } else {
            int label_text_w = 150;

            int column_1_w = (int)(window_w * 0.5f);
            int column_2_w = (int)(window_w * 0.5f) - 15;

            int component_1_w = window_w - label_text_w;
            int component_2_w = (component_1_w / 2.0f) - gui->Ctx->style->padding * 0.5f;
            int component_3_w = (component_1_w / 3.0f) - gui->Ctx->style->padding * 0.5f;
            int component_4_w = (component_1_w / 4.0f) - gui->Ctx->style->padding * 0.5f;
            int component_5_w = (component_1_w / 5.0f) - gui->Ctx->style->padding * 0.5f;

            for (GUIComponent& component : gui_components) {
                if (!component.IsInUse) {
                    continue;
                }

                int column_widths[2] = {column_1_w, column_2_w};
                mu_layout_row(gui->Ctx, 2, column_widths, 0);
                mu_layout_begin_column(gui->Ctx);
                switch (component.Type) {
                    case EGUIComponentTypeSlider1: {
                        mu_layout_row(gui->Ctx, 1, empty_width, 0);
                        break;
                    }
                    case EGUIComponentTypeSlider2: {
                        int widths[2] = { component_2_w, -1 };
                        mu_layout_row(gui->Ctx, 2, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeSlider3: {
                        int widths[3] = { component_3_w, component_3_w, -1 };
                        mu_layout_row(gui->Ctx, 3, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeColor3:
                    case EGUIComponentTypeSlider4: {
                        int widths[4] = { component_4_w, component_4_w, component_4_w, -1 };
                        mu_layout_row(gui->Ctx, 4, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeColor4: {
                        int widths[5] = { component_5_w, component_5_w, component_5_w, component_5_w, -1 };
                        mu_layout_row(gui->Ctx, 5, widths, 0);
                        break;
                    }
                }

                if (GUIIsSliderType(component.Type)) {
                    for (int i = 0; i < GUIComponents(component.Type); ++i) {
                        mu_slider_ex(gui->Ctx, &component.Data[i], component.SliderRange.Start, component.SliderRange.End, 0.01f, "%.2f", MU_OPT_ALIGNCENTER);
                    }
                } else {
                    for (int i = 0; i < GUIComponents(component.Type); ++i) {
                        component.Data[i] *= 255.0f;
                        mu_slider_ex(gui->Ctx, &component.Data[i], 0.0, 255.0f, 0, "%.0f", MU_OPT_ALIGNCENTER);
                        component.Data[i] /= 255.0f;
                    }
                    
                    mu_Color color;
                    color.r = (uint8_t)(component.Data[0] * 255.0f);
                    color.g = (uint8_t)(component.Data[1] * 255.0f);
                    color.b = (uint8_t)(component.Data[2] * 255.0f);
                    color.a = GUIComponents(component.Type) == 4 ? (uint8_t)(component.Data[3] * 255.0f) : 255;
                    mu_draw_rect(gui->Ctx, mu_layout_next(gui->Ctx), color);
                }
                mu_layout_end_column(gui->Ctx);

                mu_layout_begin_column(gui->Ctx);
                mu_layout_row(gui->Ctx, 1, empty_width, 0);
                mu_label(gui->Ctx, component.UniformName.c_str());
                mu_layout_end_column(gui->Ctx);
            }
        }
#if 0
        for (const auto& texture : textures) {
            float aspect = (float)texture.Width / (float)texture.Height;
            float max_width = ImGui::GetContentRegionAvailWidth();
            float height = max_width / aspect;

            ImGui::Image(texture.Id, ImVec2(max_width, height), ImVec2(0, 1), ImVec2(1, 0));
        }
#endif
        mu_end_window(gui->Ctx);
    }
    mu_end(gui->Ctx);

    return true;
}